

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O0

void __thiscall CgroupController::CgroupController(CgroupController *this,string *name,string *id)

{
  bool bVar1;
  Config *this_00;
  path *__lhs;
  ContextManager *pCVar2;
  value_type *pvVar3;
  undefined8 uVar4;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  error_code error;
  path local_f8;
  path local_d0;
  path local_98;
  path local_70;
  path local_48;
  string *local_20;
  string *id_local;
  string *name_local;
  CgroupController *this_local;
  
  local_20 = id;
  id_local = name;
  name_local = (string *)this;
  std::filesystem::__cxx11::path::path(&this->path_);
  this->enter_fd_ = -1;
  this_00 = Config::get();
  __lhs = Config::get_cgroup_root_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_d0,id_local,auto_format);
  std::filesystem::__cxx11::operator/(&local_98,__lhs,&local_d0);
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_f8,(char (*) [8])"libsbox",auto_format);
  std::filesystem::__cxx11::operator/(&local_70,&local_98,&local_f8);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&error._M_cat,local_20,auto_format);
  std::filesystem::__cxx11::operator/(&local_48,&local_70,(path *)&error._M_cat);
  std::filesystem::__cxx11::path::operator=(&this->path_,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path((path *)&error._M_cat);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&local_f8);
  std::filesystem::__cxx11::path::~path(&local_98);
  std::filesystem::__cxx11::path::~path(&local_d0);
  std::error_code::error_code((error_code *)local_130);
  std::filesystem::create_directories(&this->path_,(error_code *)local_130);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_130);
  if (bVar1) {
    pCVar2 = ContextManager::get();
    pvVar3 = std::filesystem::__cxx11::path::c_str(&this->path_);
    std::error_code::message_abi_cxx11_(&local_170,(error_code *)local_130);
    uVar4 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_150,"Cannot create dir \'%s\': %s",pvVar3,uVar4);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
  }
  return;
}

Assistant:

CgroupController::CgroupController(const std::string &name, const std::string &id) {
    path_ = Config::get().get_cgroup_root() / name / "libsbox" / id;
    std::error_code error;
    fs::create_directories(path_, error);
    if (error) {
        die(format("Cannot create dir '%s': %s", path_.c_str(), error.message().c_str()));
    }
}